

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::internal::UnitTestImpl::UnitTestImpl(UnitTestImpl *this,UnitTest *parent)

{
  pthread_key_t pVar1;
  ValueHolderFactory *pVVar2;
  TestEventRepeater *pTVar3;
  DeathTestFactory *pDVar4;
  ValueHolderFactory *pVVar5;
  TestEventListener *listener;
  
  this->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_0013f618;
  this->parent_ = parent;
  (this->original_working_dir_).pathname_._M_dataplus._M_p =
       (pointer)&(this->original_working_dir_).pathname_.field_2;
  (this->original_working_dir_).pathname_._M_string_length = 0;
  (this->original_working_dir_).pathname_.field_2._M_local_buf[0] = '\0';
  (this->default_global_test_part_result_reporter_).super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__TestPartResultReporterInterface_0013f3a8;
  (this->default_global_test_part_result_reporter_).unit_test_ = this;
  (this->default_per_thread_test_part_result_reporter_).super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__TestPartResultReporterInterface_0013f3d0;
  (this->default_per_thread_test_part_result_reporter_).unit_test_ = this;
  this->global_test_part_result_repoter_ =
       &(this->default_global_test_part_result_reporter_).super_TestPartResultReporterInterface;
  Mutex::Mutex(&this->global_test_part_result_reporter_mutex_);
  pVar1 = ThreadLocal<testing::TestPartResultReporterInterface_*>::CreateKey();
  (this->per_thread_test_part_result_reporter_).key_ = pVar1;
  pVVar2 = (ValueHolderFactory *)operator_new(0x10);
  pVVar2->_vptr_ValueHolderFactory = (_func_int **)&PTR__ValueHolderFactory_0013fcb8;
  pVVar2[1]._vptr_ValueHolderFactory =
       (_func_int **)&this->default_per_thread_test_part_result_reporter_;
  (this->per_thread_test_part_result_reporter_).default_factory_.ptr_ = pVVar2;
  (this->environments_).
  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->environments_).
  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->environments_).
  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->test_cases_).super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->test_cases_).super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->test_cases_).super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parameterized_test_registry_).test_case_infos_.
  super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameterized_test_registry_).test_case_infos_.
  super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameterized_test_registry_).test_case_infos_.
  super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->parameterized_tests_registered_ = false;
  this->last_death_test_case_ = -1;
  this->current_test_case_ = (TestCase *)0x0;
  this->current_test_info_ = (TestInfo *)0x0;
  Mutex::Mutex(&(this->ad_hoc_test_result_).test_properites_mutex_);
  (this->ad_hoc_test_result_).elapsed_time_ = 0;
  (this->ad_hoc_test_result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ad_hoc_test_result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ad_hoc_test_result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ad_hoc_test_result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ad_hoc_test_result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ad_hoc_test_result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ad_hoc_test_result_).death_test_count_ = 0;
  pTVar3 = (TestEventRepeater *)operator_new(0x28);
  (pTVar3->super_TestEventListener)._vptr_TestEventListener =
       (_func_int **)&PTR__TestEventRepeater_0013f458;
  pTVar3->forwarding_enabled_ = true;
  (pTVar3->listeners_).
  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar3->listeners_).
  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar3->listeners_).
  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->listeners_).repeater_ = pTVar3;
  this->random_seed_ = 0;
  this->random_ = 0;
  (this->listeners_).default_result_printer_ = (TestEventListener *)0x0;
  (this->listeners_).default_xml_generator_ = (TestEventListener *)0x0;
  *(undefined8 *)((long)&(this->listeners_).default_xml_generator_ + 1) = 0;
  *(undefined8 *)((long)&this->os_stack_trace_getter_ + 1) = 0;
  this->start_timestamp_ = 0;
  this->elapsed_time_ = 0;
  (this->internal_run_death_test_flag_).ptr_ = (InternalRunDeathTestFlag *)0x0;
  pDVar4 = (DeathTestFactory *)operator_new(8);
  pDVar4->_vptr_DeathTestFactory = (_func_int **)&PTR__DeathTestFactory_0013f848;
  (this->death_test_factory_).ptr_ = pDVar4;
  pVar1 = ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
          ::CreateKey();
  (this->gtest_trace_stack_).key_ = pVar1;
  pVVar5 = (ValueHolderFactory *)operator_new(8);
  pVVar5->_vptr_ValueHolderFactory = (_func_int **)&PTR__ValueHolderFactory_0013fd28;
  (this->gtest_trace_stack_).default_factory_.ptr_ = pVVar5;
  this->catch_exceptions_ = false;
  listener = (TestEventListener *)operator_new(8);
  listener->_vptr_TestEventListener = (_func_int **)&PTR__TestEventListener_0013f750;
  TestEventListeners::SetDefaultResultPrinter(&this->listeners_,listener);
  return;
}

Assistant:

UnitTestImpl::UnitTestImpl(UnitTest* parent)
    : parent_(parent),
      GTEST_DISABLE_MSC_WARNINGS_PUSH_(4355 /* using this in initializer */)
      default_global_test_part_result_reporter_(this),
      default_per_thread_test_part_result_reporter_(this),
      GTEST_DISABLE_MSC_WARNINGS_POP_()
      global_test_part_result_repoter_(
          &default_global_test_part_result_reporter_),
      per_thread_test_part_result_reporter_(
          &default_per_thread_test_part_result_reporter_),
      parameterized_test_registry_(),
      parameterized_tests_registered_(false),
      last_death_test_case_(-1),
      current_test_case_(NULL),
      current_test_info_(NULL),
      ad_hoc_test_result_(),
      os_stack_trace_getter_(NULL),
      post_flag_parse_init_performed_(false),
      random_seed_(0),  // Will be overridden by the flag before first use.
      random_(0),  // Will be reseeded before first use.
      start_timestamp_(0),
      elapsed_time_(0),
#if GTEST_HAS_DEATH_TEST
      death_test_factory_(new DefaultDeathTestFactory),
#endif
      // Will be overridden by the flag before first use.
      catch_exceptions_(false) {
  listeners()->SetDefaultResultPrinter(new PrettyUnitTestResultPrinter);
}